

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void libtorrent::dht::anon_unknown_0::announce_fun
               (vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *v,node *node,int listen_port,sha1_hash *ih,announce_flags_t flags)

{
  dht_observer *pdVar1;
  long lVar2;
  int iVar3;
  entry *peVar4;
  entry *peVar5;
  sha1_hash *psVar6;
  node_id *n2;
  union_endpoint *this;
  pointer ppVar7;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  span<const_char> str;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  span<const_char> in;
  shared_ptr<libtorrent::dht::announce_observer> o;
  shared_ptr<libtorrent::dht::traversal_algorithm> algo;
  entry e;
  simple_segregated_storage<unsigned_long> local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  observer_ptr local_d0;
  string_type local_c0;
  undefined1 local_a0 [24];
  long local_88;
  pointer local_80;
  undefined1 local_78 [44];
  endpoint local_4c;
  
  pdVar1 = node->m_observer;
  if ((pdVar1 != (dht_observer *)0x0) &&
     (psVar6 = ih, iVar3 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1),
     (char)iVar3 != '\0')) {
    in.m_len = (difference_type)psVar6;
    in.m_ptr = (char *)0x14;
    aux::to_hex_abi_cxx11_((string *)local_78,(aux *)ih,in);
    (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
              (pdVar1,1,"sending announce_peer [ ih: %s  p: %d nodes: %d ]",local_78._0_8_,
               (ulong)(uint)listen_port,
               (ulong)(uint)((int)((ulong)((long)(v->
                                                 super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(v->
                                                super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start) >> 5) *
                            -0x55555555));
    if (local_78._0_8_ != (long)local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,CONCAT44(local_78._20_4_,local_78._16_4_) + 1);
    }
  }
  local_78._0_8_ = 0;
  local_78._8_8_ = 0;
  local_78._16_4_ = 0;
  local_a0._0_8_ = (traversal_algorithm *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libtorrent::dht::traversal_algorithm,std::allocator<libtorrent::dht::traversal_algorithm>,libtorrent::dht::node&,libtorrent::digest32<160l>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8),
             (traversal_algorithm **)local_a0,
             (allocator<libtorrent::dht::traversal_algorithm> *)&local_4c,node,
             (digest32<160L> *)local_78);
  ::std::__shared_ptr<libtorrent::dht::traversal_algorithm,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<libtorrent::dht::traversal_algorithm,libtorrent::dht::traversal_algorithm>
            ((__shared_ptr<libtorrent::dht::traversal_algorithm,(__gnu_cxx::_Lock_policy)2> *)
             local_a0,(traversal_algorithm *)local_a0._0_8_);
  ppVar7 = (v->
           super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_80 = (v->
             super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar7 != local_80) {
    local_88 = (long)listen_port;
    local_a0._16_8_ = ZEXT18(flags.m_val & 1);
    this = &(ppVar7->first).endpoint;
    do {
      if ((pdVar1 != (dht_observer *)0x0) &&
         (iVar3 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1), (char)iVar3 != '\0')) {
        iVar3 = distance_exp((dht *)ih,(node_id *)(this + -1),n2);
        (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
                  (pdVar1,1,"announce-distance: %d",(ulong)(0xa0 - iVar3));
      }
      aux::union_endpoint::operator_cast_to_basic_endpoint((endpoint *)local_78,this);
      rpc_manager::
      allocate_observer<libtorrent::dht::announce_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,libtorrent::digest32<160l>const&>
                ((rpc_manager *)&local_e0,
                 (shared_ptr<libtorrent::dht::traversal_algorithm> *)&node->m_rpc,
                 (basic_endpoint<boost::asio::ip::udp> *)local_a0,(digest32<160L> *)local_78);
      if (local_e0.first == (void *)0x0) {
        if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
        }
        break;
      }
      entry::entry((entry *)local_78);
      key._M_str = "y";
      key._M_len = 1;
      peVar4 = entry::operator[]((entry *)local_78,key);
      entry::operator=(peVar4,"q");
      key_00._M_str = "q";
      key_00._M_len = 1;
      peVar4 = entry::operator[]((entry *)local_78,key_00);
      entry::operator=(peVar4,"announce_peer");
      key_01._M_str = "a";
      key_01._M_len = 1;
      peVar4 = entry::operator[]((entry *)local_78,key_01);
      key_02._M_str = "info_hash";
      key_02._M_len = 9;
      peVar5 = entry::operator[](peVar4,key_02);
      str.m_len = 0x14;
      str.m_ptr = (char *)ih;
      entry::operator=(peVar5,str);
      key_03._M_str = "port";
      key_03._M_len = 4;
      peVar5 = entry::operator[](peVar4,key_03);
      entry::operator=(peVar5,local_88);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      lVar2 = *(long *)((long)&this[1].addr.addr + 8);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,lVar2,*(long *)&this[1].addr.field_0x10 + lVar2);
      key_04._M_str = "token";
      key_04._M_len = 5;
      peVar5 = entry::operator[](peVar4,key_04);
      entry::operator=(peVar5,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      key_05._M_str = "seed";
      key_05._M_len = 4;
      peVar5 = entry::operator[](peVar4,key_05);
      entry::operator=(peVar5,local_a0._16_8_);
      if ((flags.m_val & 2) != 0) {
        key_06._M_str = "implied_port";
        key_06._M_len = 0xc;
        peVar4 = entry::operator[](peVar4,key_06);
        entry::operator=(peVar4,1);
      }
      counters::inc_stats_counter(node->m_counters,0x96,1);
      *(byte *)((long)local_e0.first + 0x56) = *(byte *)((long)local_e0.first + 0x56) | 1;
      aux::union_endpoint::operator_cast_to_basic_endpoint(&local_4c,this);
      local_d0.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e0.first;
      local_d0.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = local_d8;
      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_d8->_M_use_count = local_d8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_d8->_M_use_count = local_d8->_M_use_count + 1;
        }
      }
      rpc_manager::invoke(&node->m_rpc,(entry *)local_78,&local_4c,&local_d0);
      if (local_d0.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.
                   super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      entry::~entry((entry *)local_78);
      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
      }
      ppVar7 = (pointer)(this + 3);
      this = (union_endpoint *)&this[4].addr.field_0x10;
    } while (ppVar7 != local_80);
  }
  if ((uchar  [8])local_a0._8_8_ != (uchar  [8])0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
  }
  return;
}

Assistant:

void announce_fun(std::vector<std::pair<node_entry, std::string>> const& v
		, node& node, int const listen_port, sha1_hash const& ih, announce_flags_t const flags)
	{
#ifndef TORRENT_DISABLE_LOGGING
		auto* logger = node.observer();
		if (logger != nullptr && logger->should_log(dht_logger::node))
		{
			logger->log(dht_logger::node, "sending announce_peer [ ih: %s "
				" p: %d nodes: %d ]", aux::to_hex(ih).c_str(), listen_port, int(v.size()));
		}
#endif

		// create a dummy traversal_algorithm
		auto algo = std::make_shared<traversal_algorithm>(node, node_id());
		// store on the first k nodes
		for (auto const& p : v)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (logger != nullptr && logger->should_log(dht_logger::node))
			{
				logger->log(dht_logger::node, "announce-distance: %d"
					, (160 - distance_exp(ih, p.first.id)));
			}
#endif

			auto o = node.m_rpc.allocate_observer<announce_observer>(algo
				, p.first.ep(), p.first.id);
			if (!o) return;
#if TORRENT_USE_ASSERTS
			o->m_in_constructor = false;
#endif
			entry e;
			e["y"] = "q";
			e["q"] = "announce_peer";
			entry& a = e["a"];
			a["info_hash"] = ih;
			a["port"] = listen_port;
			a["token"] = p.second;
			a["seed"] = (flags & announce::seed) ? 1 : 0;
			if (flags & announce::implied_port) a["implied_port"] = 1;
			node.stats_counters().inc_stats_counter(counters::dht_announce_peer_out);
			o->flags |= observer::flag_queried;
			node.m_rpc.invoke(e, p.first.ep(), o);
		}
	}